

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O3

int make_absent_tree(Node **node,Node *absent,Node *expr,int is_range_cutter,ParseEnv *env)

{
  Bits BVar1;
  NodeType NVar2;
  int iVar3;
  Node *pNVar4;
  _Node *step_one;
  Node *pNVar5;
  int iVar6;
  BagNode *en;
  _Node *p_Var7;
  long lVar8;
  int iVar9;
  int local_b8;
  Node *local_98 [8];
  Node *local_58 [5];
  
  local_98[2] = (Node *)0x0;
  local_98[3] = (Node *)0x0;
  local_98[0] = (Node *)0x0;
  local_98[1] = (Node *)0x0;
  local_98[6] = (Node *)0x0;
  local_98[4] = expr;
  local_98[5] = absent;
  if (is_range_cutter != 0) goto LAB_00117d7b;
  if (expr != (Node *)0x0) {
    NVar2 = (expr->u).base.node_type;
    if (NVar2 == ND_QUANT) {
      local_b8 = 0;
      pNVar4 = expr;
LAB_00117f1f:
      if ((pNVar4->u).str.flag != 0) {
        step_one = (pNVar4->u).base.body;
        NVar2 = (step_one->u).base.node_type;
        if (NVar2 == ND_CCLASS) {
LAB_00117f9d:
          if (pNVar4 != expr) {
            (expr->u).base.body = (_Node *)0x0;
            node_free_body(expr);
            free(expr);
          }
          (pNVar4->u).base.body = (_Node *)0x0;
          goto LAB_00117fcf;
        }
        if ((NVar2 == ND_STRING) &&
           (p_Var7 = (step_one->u).base.body, p_Var7 < (_Node *)(step_one->u).str.end)) {
          iVar9 = 1;
          do {
            iVar3 = (*env->enc->mbc_enc_len)((OnigUChar *)p_Var7);
            p_Var7 = (_Node *)((long)&p_Var7->u + (long)iVar3);
            iVar9 = iVar9 + -1;
          } while (p_Var7 < (_Node *)(step_one->u).str.end);
          if (iVar9 == 0) goto LAB_00117f9d;
        }
      }
    }
    else if ((NVar2 == ND_BAG) && ((expr->u).cclass.bs[1] == 2)) {
      pNVar4 = (expr->u).base.body;
      local_b8 = 1;
      if ((pNVar4->u).base.node_type == ND_QUANT) goto LAB_00117f1f;
    }
LAB_00117d7b:
    iVar9 = env->id_num;
    BVar1 = iVar9 + 1;
    env->id_num = BVar1;
    local_98[0] = (Node *)calloc(1,0x48);
    iVar6 = -5;
    iVar3 = iVar6;
    if (local_98[0] != (Node *)0x0) {
      (local_98[0]->u).base.node_type = ND_GIMMICK;
      (local_98[0]->u).quant.upper = iVar9;
      (local_98[0]->u).base.body = (_Node *)0x200000001;
      env->id_num = iVar9 + 2;
      local_98[1] = (Node *)calloc(1,0x48);
      if (local_98[1] != (Node *)0x0) {
        *(undefined4 *)local_98[1] = 10;
        *(Bits *)((long)local_98[1] + 0x1c) = BVar1;
        *(undefined8 *)((long)local_98[1] + 0x10) = 0x100000001;
        pNVar4 = (Node *)calloc(1,0x48);
        if (pNVar4 != (Node *)0x0) {
          *(undefined8 *)&pNVar4->u = 0x40000000000002;
          (pNVar4->u).cclass.flags = 0xffffffff;
          local_98[3] = pNVar4;
          iVar3 = make_absent_engine(local_98 + 2,iVar9,absent,pNVar4,0,-1,1,is_range_cutter,env);
          if (iVar3 == 0) {
            local_98[5] = (Node *)0x0;
            local_98[3] = (Node *)calloc(1,0x48);
            iVar3 = iVar6;
            if (local_98[3] != (Node *)0x0) {
              (local_98[3]->u).base.node_type = ND_GIMMICK;
              (local_98[3]->u).cclass.bs[2] = BVar1;
              (local_98[3]->u).base.body = (_Node *)0x100000002;
              if (is_range_cutter == 0) {
                iVar3 = make_absent_tail(local_98 + 5,local_98 + 6,iVar9,env);
                if (iVar3 != 0) goto LAB_001181bb;
                iVar9 = 7;
              }
              else {
                iVar9 = 4;
              }
              pNVar4 = make_list_or_alt(ND_LIST,iVar9,local_98);
              iVar3 = iVar6;
              if (pNVar4 != (Node *)0x0) {
                *node = pNVar4;
                return 0;
              }
            }
          }
        }
      }
    }
    goto LAB_001181bb;
  }
  pNVar4 = (Node *)calloc(1,0x48);
  if (pNVar4 == (Node *)0x0) {
    iVar3 = -5;
    goto LAB_001181bb;
  }
  (pNVar4->u).base.node_type = ND_QUANT;
  *(undefined8 *)((long)&(pNVar4->u).str.end + 4) = 0x1ffffffff;
  step_one = (_Node *)calloc(1,0x48);
  if (step_one == (Node *)0x0) {
    iVar3 = -5;
  }
  else {
    *(undefined8 *)&step_one->u = 0x40000000000002;
    (step_one->u).cclass.flags = 0xffffffff;
    local_b8 = 0;
LAB_00117fcf:
    *node = (Node *)0x0;
    local_58[0] = (Node *)0x0;
    local_58[1] = (Node *)0x0;
    iVar9 = (pNVar4->u).quant.lower;
    iVar3 = (pNVar4->u).quant.upper;
    iVar6 = env->id_num;
    env->id_num = iVar6 + 1;
    local_58[2] = step_one;
    local_58[3] = absent;
    local_58[0] = (Node *)calloc(1,0x48);
    if (local_58[0] == (Node *)0x0) {
LAB_00118160:
      iVar3 = -5;
LAB_00118165:
      lVar8 = 0;
      do {
        pNVar5 = local_58[lVar8];
        if (pNVar5 != (Node *)0x0) {
          node_free_body(pNVar5);
          free(pNVar5);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
    }
    else {
      (local_58[0]->u).base.node_type = ND_GIMMICK;
      (local_58[0]->u).quant.upper = iVar6;
      (local_58[0]->u).base.body = (_Node *)0x200000001;
      iVar3 = make_absent_engine(local_58 + 1,iVar6,absent,step_one,iVar9,iVar3,local_b8,0,env);
      if (iVar3 != 0) goto LAB_00118165;
      local_58[2] = (Node *)calloc(1,0x48);
      local_58[3] = (Node *)0x0;
      if (local_58[2] == (Node *)0x0) goto LAB_00118160;
      (local_58[2]->u).base.node_type = ND_GIMMICK;
      (local_58[2]->u).quant.upper = iVar6;
      (local_58[2]->u).base.body = (_Node *)0x200000002;
      pNVar5 = make_list_or_alt(ND_LIST,3,local_58);
      iVar3 = -5;
      if (pNVar5 == (Node *)0x0) goto LAB_00118165;
      *node = pNVar5;
      iVar3 = 0;
    }
    node_free_body(pNVar4);
    free(pNVar4);
    if (iVar3 == 0) {
      return 0;
    }
    local_98[4] = (Node *)0x0;
    pNVar4 = step_one;
  }
  node_free_body(pNVar4);
  free(pNVar4);
LAB_001181bb:
  lVar8 = 0;
  do {
    pNVar4 = local_98[lVar8];
    if (pNVar4 != (Node *)0x0) {
      node_free_body(pNVar4);
      free(pNVar4);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  return iVar3;
}

Assistant:

static int
make_absent_tree(Node** node, Node* absent, Node* expr, int is_range_cutter,
                 ParseEnv* env)
{
  int r;
  int i;
  int id1, id2;
  int possessive;
  Node* x;
  Node* ns[7];

  r = ONIGERR_MEMORY;
  for (i = 0; i < 7; i++) ns[i] = NULL_NODE;
  ns[4] = expr; ns[5] = absent;

  if (is_range_cutter == 0) {
    Node* quant;
    Node* body;

    if (expr == NULL_NODE) {
      /* default expr \O* */
      quant = node_new_quantifier(0, INFINITE_REPEAT, FALSE);
      if (IS_NULL(quant)) goto err0;

      r = node_new_true_anychar(&body);
      if (r != 0) {
        onig_node_free(quant);
        goto err;
      }
      possessive = 0;
      goto simple;
    }
    else {
      if (is_simple_one_char_repeat(expr, &quant, &body, &possessive, env)) {
      simple:
        r = make_absent_tree_for_simple_one_char_repeat(node, absent, quant,
                                                        body, possessive, env);
        onig_node_free(quant);
        if (r != 0) {
          ns[4] = NULL_NODE;
          onig_node_free(body);
          goto err;
        }

        return ONIG_NORMAL;
      }
    }
  }

  r = node_new_save_gimmick(&ns[0], SAVE_RIGHT_RANGE, env);
  if (r != 0) goto err;

  id1 = GIMMICK_(ns[0])->id;

  r = node_new_save_gimmick(&ns[1], SAVE_S, env);
  if (r != 0) goto err;

  id2 = GIMMICK_(ns[1])->id;

  r = node_new_true_anychar(&ns[3]);
  if (r != 0) goto err;

  possessive = 1;
  r = make_absent_engine(&ns[2], id1, absent, ns[3], 0, INFINITE_REPEAT,
                         possessive, is_range_cutter, env);
  if (r != 0) goto err;

  ns[3] = NULL_NODE;
  ns[5] = NULL_NODE;

  r = node_new_update_var_gimmick(&ns[3], UPDATE_VAR_S_FROM_STACK, id2, env);
  if (r != 0) goto err;

  if (is_range_cutter != 0) {
    x = make_list(4, ns);
    if (IS_NULL(x)) goto err0;
  }
  else {
    r = make_absent_tail(&ns[5], &ns[6], id1, env);
    if (r != 0) goto err;

    x = make_list(7, ns);
    if (IS_NULL(x)) goto err0;
  }

  *node = x;
  return ONIG_NORMAL;

 err0:
  r = ONIGERR_MEMORY;
 err:
  for (i = 0; i < 7; i++) onig_node_free(ns[i]);
  return r;
}